

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendMemoryCopyRegion
          (ze_command_list_handle_t hCommandList,void *dstptr,ze_copy_region_t *dstRegion,
          uint32_t dstPitch,uint32_t dstSlicePitch,void *srcptr,ze_copy_region_t *srcRegion,
          uint32_t srcPitch,uint32_t srcSlicePitch,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ze_pfnCommandListAppendMemoryCopyRegion_t pfnAppendMemoryCopyRegion;
  ze_result_t result;
  void *srcptr_local;
  uint32_t dstSlicePitch_local;
  uint32_t dstPitch_local;
  ze_copy_region_t *dstRegion_local;
  void *dstptr_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendMemoryCopyRegion._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c398 != (code *)0x0) {
    pfnAppendMemoryCopyRegion._4_4_ =
         (*DAT_0011c398)(hCommandList,dstptr,dstRegion,dstPitch,dstSlicePitch,srcptr,srcRegion,
                         srcPitch,srcSlicePitch,hSignalEvent,numWaitEvents,phWaitEvents);
  }
  return pfnAppendMemoryCopyRegion._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryCopyRegion(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        void* dstptr,                                   ///< [in] pointer to destination memory to copy to
        const ze_copy_region_t* dstRegion,              ///< [in] pointer to destination region to copy to
        uint32_t dstPitch,                              ///< [in] destination pitch in bytes
        uint32_t dstSlicePitch,                         ///< [in] destination slice pitch in bytes. This is required for 3D region
                                                        ///< copies where the `depth` member of ::ze_copy_region_t is not 0,
                                                        ///< otherwise it's ignored.
        const void* srcptr,                             ///< [in] pointer to source memory to copy from
        const ze_copy_region_t* srcRegion,              ///< [in] pointer to source region to copy from
        uint32_t srcPitch,                              ///< [in] source pitch in bytes
        uint32_t srcSlicePitch,                         ///< [in] source slice pitch in bytes. This is required for 3D region
                                                        ///< copies where the `depth` member of ::ze_copy_region_t is not 0,
                                                        ///< otherwise it's ignored.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMemoryCopyRegion = context.zeDdiTable.CommandList.pfnAppendMemoryCopyRegion;
        if( nullptr != pfnAppendMemoryCopyRegion )
        {
            result = pfnAppendMemoryCopyRegion( hCommandList, dstptr, dstRegion, dstPitch, dstSlicePitch, srcptr, srcRegion, srcPitch, srcSlicePitch, hSignalEvent, numWaitEvents, phWaitEvents );
        }
        else
        {
            // generic implementation
        }

        return result;
    }